

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void __thiscall
CRenderTools::RenderCursor(CRenderTools *this,float CenterX,float CenterY,float Size)

{
  IGraphics *pIVar1;
  CRenderTools *in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  CQuadItem QuadItem;
  CQuadItem local_1c;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar1 = Graphics(in_RDI);
  local_c = g_pData->m_aImages[4].m_Id.m_Id;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x13])(pIVar1,(ulong)local_c);
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0xb])();
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x17])();
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x21])(0x3f800000,0x3f800000,0x3f800000);
  IGraphics::CQuadItem::CQuadItem(&local_1c,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da,in_XMM2_Da);
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_1c,1);
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x18])();
  pIVar1 = Graphics(in_RDI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[10])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CRenderTools::RenderCursor(float CenterX, float CenterY, float Size)
{
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_CURSOR].m_Id);
	Graphics()->WrapClamp();
	Graphics()->QuadsBegin();
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	IGraphics::CQuadItem QuadItem(CenterX, CenterY, Size, Size);
	Graphics()->QuadsDrawTL(&QuadItem, 1);
	Graphics()->QuadsEnd();
	Graphics()->WrapNormal();
}